

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

void __thiscall
level_tools::push_subdivisions_v5
          (level_tools *this,level_mesh *mesh,uint16_t sector_idx,uint32_t ogf_idx)

{
  uint16_t texture;
  pointer ppxVar1;
  xr_ogf *pxVar2;
  uint32_t *puVar3;
  bool bVar4;
  int iVar5;
  uint32_t eshader_idx;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t *puVar8;
  
  ppxVar1 = (this->m_subdivisions->
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_subdivisions->
                    super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppxVar1 >> 3) <=
      (ulong)ogf_idx) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  pxVar2 = ppxVar1[ogf_idx];
  iVar5 = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x16])
                    (pxVar2);
  if ((char)iVar5 == '\0') {
    eshader_idx = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                    [0x1e])(pxVar2);
    bVar4 = is_compiled_wallmark(this,eshader_idx);
    if (!bVar4) {
      iVar5 = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                        (pxVar2);
      iVar6 = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])
                        (pxVar2);
      uVar7 = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1d])
                        (pxVar2);
      texture = (this->m_uniq_textures).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
      uVar7 = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1e])
                        (pxVar2);
      level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var,iVar5),
                       (xr_ibuf *)CONCAT44(extraout_var_00,iVar6),texture,
                       (this->m_uniq_shaders).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7]);
      return;
    }
  }
  else {
    puVar3 = (pxVar2->m_children_l).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (pxVar2->m_children_l).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1) {
      push_subdivisions_v5(this,mesh,sector_idx,*puVar8);
    }
  }
  return;
}

Assistant:

void level_tools::push_subdivisions_v5(level_mesh* mesh, uint16_t sector_idx, uint32_t ogf_idx)
{
	xr_ogf_v3* ogf = static_cast<xr_ogf_v3*>(m_subdivisions->at(ogf_idx));
	if (ogf->hierarchical()) {
		for (std::vector<uint32_t>::const_iterator it = ogf->children_l().begin(),
				end = ogf->children_l().end(); it != end; ++it) {
			push_subdivisions_v5(mesh, sector_idx, *it);
		}
	} else if (is_compiled_wallmark(ogf->shader_l())) {
		;
	} else {
		mesh->push(sector_idx, ogf->vb(), ogf->ib(),
				m_uniq_textures[ogf->texture_l()],
				m_uniq_shaders[ogf->shader_l()]);
	}
}